

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlSelect.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlSelect::OnAttributeChange
          (ElementFormControlSelect *this,ElementAttributes *changed_attributes)

{
  WidgetDropDown *this_00;
  code *pcVar1;
  bool bVar2;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->widget == (WidgetDropDown *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(widget)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Elements/ElementFormControlSelect.cpp"
                   ,0xb8);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  cVar3 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[6]>(changed_attributes,(char (*) [6])0x31c259);
  if (cVar3._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = this->widget;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&local_30,&(cVar3._M_current)->second,&local_50);
    WidgetDropDown::OnValueChange(this_00,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void ElementFormControlSelect::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	RMLUI_ASSERT(widget);

	ElementFormControl::OnAttributeChange(changed_attributes);

	auto it = changed_attributes.find("value");
	if (it != changed_attributes.end())
		widget->OnValueChange(it->second.Get<String>());
}